

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexGroup.cpp
# Opt level: O3

void __thiscall VertexGroup::delVertex(VertexGroup *this,int _id)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  _Self __tmp;
  
  if (_id < 1000000) {
    lVar2 = (long)_id;
    this->isDeleted[lVar2] = true;
    for (p_Var1 = *(_Rb_tree_node_base **)(&this->field_0x38 + lVar2 * 0x50);
        p_Var1 != (_Rb_tree_node_base *)(&this->field_0x28 + lVar2 * 0x50);
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      Vertex::delNeighborVertex
                ((Vertex *)(&this->field_0x0 + (long)(int)p_Var1[1]._M_color * 0x50),_id);
    }
  }
  return;
}

Assistant:

void VertexGroup::delVertex(int _id){
	if(_id >= Config::MAX_NUM_VERTICES){
		return;
	}	
	isDeleted[_id] = true;

	for(set<int>::iterator it = group[_id].neighborVertexIds.begin();it != group[_id].neighborVertexIds.end();it++){
		group[(*it)].delNeighborVertex(_id);
	}

}